

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_EQ_RANGE_Test::Body
          (iu_SyntaxTest_x_iutest_x_EQ_RANGE_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  int (*in_R9) [5];
  AssertionHelper local_7f8;
  Fixed local_7c8;
  undefined1 local_640 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_610 [4];
  int size_3;
  Fixed local_5e0;
  undefined1 local_458 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_428 [4];
  int size_2;
  Fixed local_3f8;
  undefined1 local_270 [8];
  AssertionResult iutest_ar_1;
  int size_1;
  Fixed local_210;
  undefined1 local_78 [8];
  AssertionResult iutest_ar;
  int iStack_48;
  int size;
  int b [5];
  char local_28 [8];
  int a [5];
  iu_SyntaxTest_x_iutest_x_EQ_RANGE_Test *this_local;
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\x01';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  a[0] = 2;
  a[1] = 3;
  a[2] = 4;
  iStack_48 = 0;
  size = 1;
  b[0] = 2;
  b[1] = 3;
  b[2] = 4;
  iutest_ar._36_4_ = 5;
  unique0x10000580 = this;
  iutest::detail::AlwaysZero();
  iuutil::CmpHelperEqRange<int[5],int[5]>
            ((AssertionResult *)local_78,(iuutil *)0x54d379,"b",local_28,(int (*) [5])&iStack_48,
             in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    memset(&local_210,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_210);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_210,iutest_ar._36_4_);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_78);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&size_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x8c,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&size_1,pFVar2);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&size_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = true;
    iutest_ar_1._33_3_ = 0;
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperEqRange<int[5],int[5]>
              ((AssertionResult *)local_270,(iuutil *)0x54d379,"b",local_28,(int (*) [5])&iStack_48,
               in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      memset(&local_3f8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3f8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3f8,iutest_ar_1._32_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_270);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x8e,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_428,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_428);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3f8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    iutest_ar_2._36_4_ = 5;
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperEqRange<int[5],int[5]>
              ((AssertionResult *)local_458,(iuutil *)0x54d379,"b",local_28,(int (*) [5])&iStack_48,
               in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
    if (!bVar1) {
      memset(&local_5e0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5e0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5e0,iutest_ar_2._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_458);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x90,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_610,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_610);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5e0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_458);
    iutest_ar_3._36_4_ = 5;
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperEqRange<int[5],int[5]>
              ((AssertionResult *)local_640,(iuutil *)0x54d379,"b",local_28,(int (*) [5])&iStack_48,
               in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
    if (!bVar1) {
      memset(&local_7c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7c8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_7c8,iutest_ar_3._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_640);
      iutest::AssertionHelper::AssertionHelper
                (&local_7f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x92,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7f8,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7c8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, EQ_RANGE)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 1, 2, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSERT_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_EXPECT_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_INFORM_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSUME_EQ_RANGE(a, b) << size;
}